

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

void __thiscall
mp::internal::BinaryReaderBase::ReportError
          (BinaryReaderBase *this,CStringRef format_str,ArgList *args)

{
  size_t offset_00;
  BinaryReadError *this_00;
  CStringRef message;
  size_t offset;
  MemoryWriter w;
  
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0014db88;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0014dbd0;
  offset = *(long *)(this + 0x18) - *(long *)(this + 8);
  fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long>
            (&w.super_BasicWriter<char>,(BasicCStringRef<char>)0x135673,(string *)(this + 0x20),
             &offset);
  fmt::BasicWriter<char>::write
            (&w.super_BasicWriter<char>,(int)format_str.data_,(void *)args->types_,
             (size_t)args->field_1);
  this_00 = (BinaryReadError *)__cxa_allocate_exception(0x40);
  offset_00 = offset;
  message.data_ = fmt::BasicWriter<char>::c_str(&w.super_BasicWriter<char>);
  BinaryReadError::BinaryReadError(this_00,(string *)(this + 0x20),offset_00,message);
  __cxa_throw(this_00,&BinaryReadError::typeinfo,BinaryReadError::~BinaryReadError);
}

Assistant:

void mp::internal::BinaryReaderBase::ReportError(
    fmt::CStringRef format_str, const fmt::ArgList &args) {
  fmt::MemoryWriter w;
  std::size_t offset = token_ - start_;
  w.write("{}:offset {}: ", name_, offset);
  w.write(format_str, args);
  throw BinaryReadError(name_, offset, w.c_str());
}